

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void __thiscall Fl_Widget::damage(Fl_Widget *this,uchar fl,int X,int Y,int W,int H)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  Fl_Region p_Var4;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  XRectangle R;
  Fl_X *i;
  Fl_Widget *wi;
  int local_20;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  uchar fl_local;
  Fl_Widget *this_local;
  
  i = (Fl_X *)this;
  Y_local._3_1_ = fl;
  while( true ) {
    bVar1 = type((Fl_Widget *)i);
    if (0xef < bVar1) {
      R = (XRectangle)Fl_X::i((Fl_Window *)i);
      if (R != (XRectangle)0x0) {
        local_20 = W;
        W_local = X;
        if (X < 0) {
          local_20 = X + W;
          W_local = 0;
        }
        wi._4_4_ = H;
        H_local = Y;
        if (Y < 0) {
          wi._4_4_ = Y + H;
          H_local = 0;
        }
        iVar3 = w((Fl_Widget *)i);
        if (iVar3 - W_local < local_20) {
          local_20 = w((Fl_Widget *)i);
          local_20 = local_20 - W_local;
        }
        iVar3 = h((Fl_Widget *)i);
        if (iVar3 - H_local < wi._4_4_) {
          iVar3 = h((Fl_Widget *)i);
          wi._4_4_ = iVar3 - H_local;
        }
        if ((0 < local_20) && (0 < wi._4_4_)) {
          if ((W_local == 0) &&
             (((H_local == 0 && (iVar3 = w((Fl_Widget *)i), local_20 == iVar3)) &&
              (iVar3 = h((Fl_Widget *)i), wi._4_4_ == iVar3)))) {
            damage((Fl_Widget *)i,Y_local._3_1_);
          }
          else {
            uVar2 = damage((Fl_Widget *)i);
            if (uVar2 == '\0') {
              if (*(long *)((long)R + 0x18) != 0) {
                XDestroyRegion(*(undefined8 *)((long)R + 0x18));
              }
              p_Var4 = XRectangleRegion(W_local,H_local,local_20,wi._4_4_);
              *(Fl_Region *)((long)R + 0x18) = p_Var4;
              *(byte *)((long)&i[2].other_xid + 5) = Y_local._3_1_;
            }
            else {
              if (*(long *)((long)R + 0x18) != 0) {
                local_40 = (undefined2)W_local;
                local_3e = (undefined2)H_local;
                local_3c = (undefined2)local_20;
                local_3a = (undefined2)wi._4_4_;
                XUnionRectWithRegion
                          (&local_40,*(undefined8 *)((long)R + 0x18),*(undefined8 *)((long)R + 0x18)
                          );
              }
              *(byte *)((long)&i[2].other_xid + 5) =
                   *(byte *)((long)&i[2].other_xid + 5) | Y_local._3_1_;
            }
            Fl::damage(1);
          }
        }
      }
      return;
    }
    *(byte *)((long)&i[2].other_xid + 5) = *(byte *)((long)&i[2].other_xid + 5) | Y_local._3_1_;
    i = (Fl_X *)parent((Fl_Widget *)i);
    if ((Fl_Group *)i == (Fl_Group *)0x0) break;
    Y_local._3_1_ = 1;
  }
  return;
}

Assistant:

void Fl_Widget::damage(uchar fl, int X, int Y, int W, int H) {
  Fl_Widget* wi = this;
  // mark all parent widgets between this and window with FL_DAMAGE_CHILD:
  while (wi->type() < FL_WINDOW) {
    wi->damage_ |= fl;
    wi = wi->parent();
    if (!wi) return;
    fl = FL_DAMAGE_CHILD;
  }
  Fl_X* i = Fl_X::i((Fl_Window*)wi);
  if (!i) return; // window not mapped, so ignore it

  // clip the damage to the window and quit if none:
  if (X < 0) {W += X; X = 0;}
  if (Y < 0) {H += Y; Y = 0;}
  if (W > wi->w()-X) W = wi->w()-X;
  if (H > wi->h()-Y) H = wi->h()-Y;
  if (W <= 0 || H <= 0) return;

  if (!X && !Y && W==wi->w() && H==wi->h()) {
    // if damage covers entire window delete region:
    wi->damage(fl);
    return;
  }

  if (wi->damage()) {
    // if we already have damage we must merge with existing region:
    if (i->region) {
#if defined(USE_X11)
      XRectangle R;
      R.x = X; R.y = Y; R.width = W; R.height = H;
      XUnionRectWithRegion(&R, i->region, i->region);
#elif defined(WIN32)
      Fl_Region R = XRectangleRegion(X, Y, W, H);
      CombineRgn(i->region, i->region, R, RGN_OR);
      XDestroyRegion(R);
#elif defined(__APPLE_QUARTZ__)
      CGRect arg = fl_cgrectmake_cocoa(X, Y, W, H);
      int j; // don't add a rectangle totally inside the Fl_Region
      for(j = 0; j < i->region->count; j++) {
        if(CGRectContainsRect(i->region->rects[j], arg)) break;
      }
      if( j >= i->region->count) {
        i->region->rects = (CGRect*)realloc(i->region->rects, (++(i->region->count)) * sizeof(CGRect));
        i->region->rects[i->region->count - 1] = arg;
      }
#else
# error unsupported platform
#endif
    }
    wi->damage_ |= fl;
  } else {
    // create a new region:
    if (i->region) XDestroyRegion(i->region);
    i->region = XRectangleRegion(X,Y,W,H);
    wi->damage_ = fl;
  }
  Fl::damage(FL_DAMAGE_CHILD);
}